

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall
ManySubcommands_Required2Fuzzy_Test::~ManySubcommands_Required2Fuzzy_Test
          (ManySubcommands_Required2Fuzzy_Test *this)

{
  TApp::~TApp((TApp *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ManySubcommands, Required2Fuzzy) {
    app.require_subcommand(0, 2);

    run();
    EXPECT_EQ(sub2->remaining(), vs_t({"sub3"}));
    EXPECT_EQ(app.remaining(true), vs_t({"sub3"}));

    app.reset();
    app.require_subcommand(-2);

    run();
    EXPECT_EQ(sub2->remaining(), vs_t({"sub3"}));
}